

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O3

size_t __thiscall
Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_>::SignalLink::add_before
          (SignalLink *this,CbFunction *cb)

{
  SignalLink *pSVar1;
  SignalLink *pSVar2;
  
  pSVar2 = (SignalLink *)operator_new(0x38);
  pSVar2->next = (SignalLink *)0x0;
  pSVar2->prev = (SignalLink *)0x0;
  std::function<bool_()>::function(&pSVar2->function,cb);
  pSVar2->ref_count = 1;
  pSVar1 = this->prev;
  pSVar2->prev = pSVar1;
  pSVar2->next = this;
  pSVar1->next = pSVar2;
  this->prev = pSVar2;
  return (size_t)pSVar2;
}

Assistant:

size_t
    add_before (const CbFunction &cb)
    {
      SignalLink *link = new SignalLink (cb);
      link->prev = prev; // link to last
      link->next = this;
      prev->next = link; // link from last
      prev = link;
      static_assert (sizeof (link) == sizeof (size_t), "sizeof size_t");
      return size_t (link);
    }